

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse2_128_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_rowcol_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  short *psVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int32_t index;
  int iVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  parasail_result_t *ppVar33;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int16_t *ptr_06;
  long lVar34;
  ulong uVar35;
  uint uVar36;
  int iVar37;
  size_t len;
  __m128i *palVar38;
  long lVar39;
  uint uVar40;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  uint uVar41;
  undefined4 uVar42;
  uint uVar43;
  int iVar44;
  undefined4 in_register_00000084;
  long lVar45;
  long lVar46;
  ulong uVar47;
  uint uVar48;
  undefined4 uVar50;
  uint uVar51;
  ulong uVar52;
  ulong uVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  ulong uVar62;
  ulong uVar63;
  ushort uVar67;
  ulong uVar68;
  ushort uVar76;
  ushort uVar77;
  ushort uVar79;
  ushort uVar82;
  ushort uVar83;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  ushort uVar78;
  ushort uVar84;
  undefined1 auVar75 [16];
  ulong uVar80;
  ulong uVar81;
  short sVar85;
  short sVar92;
  ulong uVar86;
  short sVar90;
  short sVar91;
  short sVar93;
  short sVar95;
  short sVar96;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  short sVar97;
  ulong uVar94;
  ushort uVar98;
  ulong uVar99;
  ushort uVar102;
  ushort uVar103;
  ushort uVar106;
  int iVar107;
  ushort uVar110;
  undefined1 auVar100 [16];
  int iVar104;
  ushort uVar105;
  ushort uVar109;
  int iVar111;
  ushort uVar112;
  undefined1 auVar101 [16];
  ulong uVar108;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined4 uVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  int iVar135;
  int iVar144;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  __m128i alVar153;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  ushort uVar172;
  int iVar173;
  ushort uVar175;
  ushort uVar176;
  int iVar177;
  ushort uVar178;
  ushort uVar179;
  int iVar180;
  ushort uVar181;
  ushort uVar182;
  int iVar183;
  ushort uVar184;
  undefined1 auVar174 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  undefined1 local_218 [16];
  undefined1 local_1e8 [16];
  undefined8 local_168;
  undefined8 uStack_160;
  ushort local_118;
  ushort uStack_116;
  int local_f8;
  undefined4 uStack_f4;
  uint uStack_f0;
  undefined4 uStack_ec;
  short local_78;
  short sStack_76;
  short sVar49;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar64;
  short sVar65;
  short sVar66;
  
  len = CONCAT44(in_register_00000084,gap);
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_rowcol_scan_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_stats_rowcol_scan_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_rowcol_scan_profile_sse2_128_16_cold_6();
      }
      else {
        uVar31 = profile->s1Len;
        if ((int)uVar31 < 1) {
          parasail_nw_stats_rowcol_scan_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_rowcol_scan_profile_sse2_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_stats_rowcol_scan_profile_sse2_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_nw_stats_rowcol_scan_profile_sse2_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_stats_rowcol_scan_profile_sse2_128_16_cold_1();
        }
        else {
          uVar41 = uVar31 - 1;
          uVar47 = (ulong)uVar31 + 7 >> 3;
          uVar53 = (ulong)uVar41 % uVar47;
          iVar29 = (int)(uVar41 / uVar47);
          uVar48 = -open;
          uVar40 = ppVar5->min;
          iVar37 = -uVar40;
          if (uVar40 != uVar48 && SBORROW4(uVar40,uVar48) == (int)(uVar40 + open) < 0) {
            iVar37 = open;
          }
          pvVar6 = (profile->profile16).matches;
          iVar104 = ppVar5->max;
          pvVar7 = (profile->profile16).similar;
          ppVar33 = parasail_result_new_rowcol3((uint)((ulong)uVar31 + 7) & 0x7ffffff8,s2Len);
          if (ppVar33 != (parasail_result_t *)0x0) {
            ppVar33->flag = ppVar33->flag | 0x8250401;
            b = parasail_memalign___m128i(0x10,uVar47);
            b_00 = parasail_memalign___m128i(0x10,uVar47);
            b_01 = parasail_memalign___m128i(0x10,uVar47);
            b_02 = parasail_memalign___m128i(0x10,uVar47);
            ptr = parasail_memalign___m128i(0x10,uVar47);
            b_03 = parasail_memalign___m128i(0x10,uVar47);
            b_04 = parasail_memalign___m128i(0x10,uVar47);
            b_05 = parasail_memalign___m128i(0x10,uVar47);
            ptr_00 = parasail_memalign___m128i(0x10,uVar47);
            ptr_01 = parasail_memalign___m128i(0x10,uVar47);
            ptr_02 = parasail_memalign___m128i(0x10,uVar47);
            ptr_03 = parasail_memalign___m128i(0x10,uVar47);
            ptr_04 = parasail_memalign___m128i(0x10,uVar47);
            ptr_05 = parasail_memalign___m128i(0x10,uVar47);
            uVar42 = 0x10;
            ptr_06 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            auVar72._0_4_ = -(uint)((int)b == 0);
            auVar72._4_4_ = -(uint)((int)((ulong)b >> 0x20) == 0);
            auVar72._8_4_ = -(uint)((int)b_00 == 0);
            auVar72._12_4_ = -(uint)((int)((ulong)b_00 >> 0x20) == 0);
            auVar121._4_4_ = auVar72._0_4_;
            auVar121._0_4_ = auVar72._4_4_;
            auVar121._8_4_ = auVar72._12_4_;
            auVar121._12_4_ = auVar72._8_4_;
            auVar126._0_4_ = -(uint)((int)b_01 == 0);
            auVar126._4_4_ = -(uint)((int)((ulong)b_01 >> 0x20) == 0);
            auVar126._8_4_ = -(uint)((int)b_02 == 0);
            auVar126._12_4_ = -(uint)((int)((ulong)b_02 >> 0x20) == 0);
            auVar185._4_4_ = auVar126._0_4_;
            auVar185._0_4_ = auVar126._4_4_;
            auVar185._8_4_ = auVar126._12_4_;
            auVar185._12_4_ = auVar126._8_4_;
            auVar126 = packssdw(auVar121 & auVar72,auVar185 & auVar126);
            auVar54._0_4_ = -(uint)((int)ptr == 0);
            auVar54._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
            auVar54._8_4_ = -(uint)((int)b_03 == 0);
            auVar54._12_4_ = -(uint)((int)((ulong)b_03 >> 0x20) == 0);
            auVar100._4_4_ = auVar54._0_4_;
            auVar100._0_4_ = auVar54._4_4_;
            auVar100._8_4_ = auVar54._12_4_;
            auVar100._12_4_ = auVar54._8_4_;
            auVar127._0_4_ = -(uint)((int)b_04 == 0);
            auVar127._4_4_ = -(uint)((int)((ulong)b_04 >> 0x20) == 0);
            auVar127._8_4_ = -(uint)((int)b_05 == 0);
            auVar127._12_4_ = -(uint)((int)((ulong)b_05 >> 0x20) == 0);
            auVar55._4_4_ = auVar127._0_4_;
            auVar55._0_4_ = auVar127._4_4_;
            auVar55._8_4_ = auVar127._12_4_;
            auVar55._12_4_ = auVar127._8_4_;
            auVar115 = packssdw(auVar100 & auVar54,auVar55 & auVar127);
            auVar115 = packssdw(auVar126,auVar115);
            auVar127 = packsswb(auVar115,auVar115);
            auVar115._0_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0 && (int)ptr_00 == 0);
            auVar115._4_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
            auVar115._8_4_ = -(uint)((int)((ulong)ptr_02 >> 0x20) == 0 && (int)ptr_02 == 0);
            auVar115._12_4_ = -(uint)((int)ptr_03 == 0 && (int)((ulong)ptr_03 >> 0x20) == 0);
            uVar42 = movmskps(uVar42,auVar115);
            if (((ptr_05 != (__m128i *)0x0 && ptr_04 != (__m128i *)0x0) && ptr_06 != (int16_t *)0x0)
                && ((char)uVar42 == '\0' &&
                   ((((((((auVar127 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar127 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar127 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar127 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar127 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar127 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar127 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar127 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0))) {
              iVar30 = s2Len + -1;
              local_1e8 = ZEXT416((uint)open);
              auVar115 = pshuflw(local_1e8,local_1e8,0);
              uVar42 = auVar115._0_4_;
              auVar115 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar50 = auVar115._0_4_;
              uVar31 = iVar37 - 0x7fff;
              auVar54 = pshuflw(ZEXT416(uVar31),ZEXT416(uVar31),0);
              local_118 = auVar54._0_2_;
              uStack_116 = auVar54._2_2_;
              auVar115 = ZEXT416((uint)CONCAT62((int6)((ulong)pvVar6 >> 0x10),
                                                0x7ffe - (short)iVar104));
              auVar55 = pshuflw(auVar115,auVar115,0);
              local_78 = auVar55._0_2_;
              sStack_76 = auVar55._2_2_;
              uVar40 = (uint)uVar47;
              auVar115 = pshuflw(ZEXT416(uVar40),ZEXT416(uVar40),0);
              uVar51 = auVar115._0_4_;
              auVar115 = pshuflw(ZEXT416(-(uVar40 * gap)),ZEXT416(-(uVar40 * gap)),0);
              uVar36 = auVar115._0_4_;
              auVar139._0_8_ = CONCAT44(uVar36,uVar36);
              auVar139._8_4_ = uVar36;
              auVar139._12_4_ = uVar36;
              auVar159._0_8_ = auVar139._0_8_ << 0x10;
              auVar159._8_8_ = auVar139._8_8_ << 0x10 | (ulong)(uVar36 >> 0x10);
              auVar126 = paddsw(auVar159,ZEXT416(uVar31 & 0xffff));
              alVar153[1] = uVar47;
              alVar153[0] = uVar47;
              parasail_memset___m128i(b_03,alVar153,len);
              c[1] = extraout_RDX;
              c[0] = uVar47;
              parasail_memset___m128i(b_04,c,len);
              c_00[1] = extraout_RDX_00;
              c_00[0] = uVar47;
              parasail_memset___m128i(b_05,c_00,len);
              c_01[1] = extraout_RDX_01;
              c_01[0] = uVar47;
              parasail_memset___m128i(b,c_01,len);
              c_02[1] = extraout_RDX_02;
              c_02[0] = uVar47;
              parasail_memset___m128i(b_00,c_02,len);
              c_03[1] = extraout_RDX_03;
              c_03[0] = uVar47;
              parasail_memset___m128i(b_01,c_03,len);
              c_04[1] = extraout_RDX_04;
              c_04[0] = uVar47;
              parasail_memset___m128i(b_02,c_04,len);
              auVar115 = _DAT_00904d10;
              auVar57._4_4_ = uVar50;
              auVar57._0_4_ = uVar50;
              auVar57._8_4_ = uVar50;
              auVar57._12_4_ = uVar50;
              auVar73._4_4_ = uVar42;
              auVar73._0_4_ = uVar42;
              auVar73._8_4_ = uVar42;
              auVar73._12_4_ = uVar42;
              auVar100 = psubsw((undefined1  [16])0x0,auVar73);
              uVar81 = (ulong)(uVar40 - 1);
              lVar34 = uVar81 << 4;
              uVar35 = uVar47;
              auVar127 = _DAT_00904d10;
              do {
                *(undefined1 (*) [16])((long)*ptr_04 + lVar34) = auVar100;
                *(undefined1 (*) [16])((long)*ptr_05 + lVar34) = auVar127;
                auVar72 = _DAT_00904aa0;
                auVar100 = psubsw(auVar100,auVar57);
                auVar127 = paddsw(auVar127,auVar115);
                lVar34 = lVar34 + -0x10;
                iVar37 = (int)uVar35;
                uVar36 = iVar37 - 1;
                uVar35 = (ulong)uVar36;
              } while (uVar36 != 0 && 0 < iVar37);
              uVar35 = 0;
              palVar38 = ptr;
              do {
                auVar167._8_4_ = (int)uVar35;
                auVar167._0_8_ = uVar35;
                auVar167._12_4_ = (int)(uVar35 >> 0x20);
                lVar34 = auVar167._8_8_;
                auVar113._4_4_ = gap;
                auVar113._0_4_ = gap;
                auVar113._8_4_ = gap;
                auVar113._12_4_ = gap;
                auVar145._0_4_ = uVar48 - (int)((uVar35 & 0xffffffff) * (ulong)(uint)gap);
                auVar145._4_4_ = uVar48 - (int)((lVar34 + uVar47 & 0xffffffff) * (ulong)(uint)gap);
                auVar145._8_4_ =
                     uVar48 - (int)((uVar47 * 2 + uVar35 & 0xffffffff) * (ulong)(uint)gap);
                auVar145._12_4_ =
                     uVar48 - (int)((uVar47 * 3 + lVar34 & 0xffffffff) * (ulong)(uint)gap);
                auVar150._0_4_ =
                     uVar48 - (int)((uVar47 * 4 + uVar35 & 0xffffffff) * (ulong)(uint)gap);
                auVar150._4_4_ =
                     uVar48 - (int)((uVar47 * 5 + lVar34 & 0xffffffff) * (ulong)(uint)gap);
                auVar150._8_4_ =
                     uVar48 - (int)((uVar47 * 6 + uVar35 & 0xffffffff) * (ulong)(uint)gap);
                auVar150._12_4_ =
                     uVar48 - (int)((uVar47 * 7 + lVar34 & 0xffffffff) * (ulong)(uint)gap);
                iVar37 = auVar72._0_4_;
                auVar155._0_4_ = -(uint)(iVar37 < auVar150._0_4_);
                iVar104 = auVar72._4_4_;
                auVar155._4_4_ = -(uint)(iVar104 < auVar150._4_4_);
                iVar107 = auVar72._8_4_;
                auVar155._8_4_ = -(uint)(iVar107 < auVar150._8_4_);
                iVar111 = auVar72._12_4_;
                auVar155._12_4_ = -(uint)(iVar111 < auVar150._12_4_);
                auVar127 = ~auVar155 & auVar72 | auVar150 & auVar155;
                auVar151._0_4_ = -(uint)(iVar37 < auVar145._0_4_);
                auVar151._4_4_ = -(uint)(iVar104 < auVar145._4_4_);
                auVar151._8_4_ = -(uint)(iVar107 < auVar145._8_4_);
                auVar151._12_4_ = -(uint)(iVar111 < auVar145._12_4_);
                auVar145 = auVar145 & auVar151;
                auVar115 = ~auVar151 & auVar72 | auVar145;
                auVar152._0_4_ = (int)auVar115._0_2_;
                auVar152._4_4_ = (int)auVar115._4_2_;
                auVar152._8_4_ = (int)auVar115._8_2_;
                auVar152._12_4_ = (int)auVar115._12_2_;
                auVar156._0_4_ = (int)auVar127._0_2_;
                auVar156._4_4_ = (int)auVar127._4_2_;
                auVar156._8_4_ = (int)auVar127._8_2_;
                auVar156._12_4_ = (int)auVar127._12_2_;
                alVar153 = (__m128i)packssdw(auVar152,auVar156);
                *palVar38 = alVar153;
                uVar35 = uVar35 + 1;
                palVar38 = palVar38 + 1;
              } while (uVar47 != uVar35);
              *ptr_06 = 0;
              auVar115 = _DAT_00903aa0;
              lVar34 = (ulong)(uint)s2Len - 1;
              auVar116._8_4_ = (int)lVar34;
              auVar116._0_8_ = lVar34;
              auVar116._12_4_ = (int)((ulong)lVar34 >> 0x20);
              iVar32 = -gap;
              iVar44 = gap * 2;
              uVar35 = 0;
              auVar157._8_4_ = 0xffffffff;
              auVar157._0_8_ = 0xffffffffffffffff;
              auVar157._12_4_ = 0xffffffff;
              uVar36 = uVar48;
              do {
                uVar117 = (undefined4)uVar35;
                auVar169._8_4_ = uVar117;
                auVar169._0_8_ = uVar35;
                auVar169._12_4_ = (int)(uVar35 >> 0x20);
                auVar100 = auVar116 ^ auVar115;
                auVar127 = (auVar169 | _DAT_00903a90) ^ auVar115;
                iVar173 = auVar100._0_4_;
                iVar135 = -(uint)(iVar173 < auVar127._0_4_);
                iVar177 = auVar100._4_4_;
                auVar119._4_4_ = -(uint)(iVar177 < auVar127._4_4_);
                iVar180 = auVar100._8_4_;
                iVar144 = -(uint)(iVar180 < auVar127._8_4_);
                iVar183 = auVar100._12_4_;
                auVar119._12_4_ = -(uint)(iVar183 < auVar127._12_4_);
                auVar128._4_4_ = iVar135;
                auVar128._0_4_ = iVar135;
                auVar128._8_4_ = iVar144;
                auVar128._12_4_ = iVar144;
                auVar100 = pshuflw(auVar145,auVar128,0xe8);
                auVar118._4_4_ = -(uint)(auVar127._4_4_ == iVar177);
                auVar118._12_4_ = -(uint)(auVar127._12_4_ == iVar183);
                auVar118._0_4_ = auVar118._4_4_;
                auVar118._8_4_ = auVar118._12_4_;
                auVar185 = pshuflw(in_XMM15,auVar118,0xe8);
                auVar119._0_4_ = auVar119._4_4_;
                auVar119._8_4_ = auVar119._12_4_;
                auVar127 = pshuflw(auVar100,auVar119,0xe8);
                auVar127 = (auVar127 | auVar185 & auVar100) ^ auVar157;
                auVar127 = packssdw(auVar127,auVar127);
                uVar43 = gap * -3 + uVar36;
                auVar164._0_4_ = -(uint)(iVar37 < (int)uVar36);
                auVar164._4_4_ = -(uint)(iVar104 < iVar32 - open);
                auVar164._8_4_ = -(uint)(iVar107 < (int)(uVar48 - iVar44));
                auVar164._12_4_ = -(uint)(iVar111 < (int)uVar43);
                auVar165._0_4_ = uVar36 & auVar164._0_4_;
                auVar165._4_4_ = iVar32 - open & auVar164._4_4_;
                auVar165._8_4_ = uVar48 - iVar44 & auVar164._8_4_;
                auVar165._12_4_ = uVar43 & auVar164._12_4_;
                auVar165 = ~auVar164 & auVar72 | auVar165;
                if ((auVar127 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar35 + 1] = auVar165._0_2_;
                }
                auVar119 = auVar118 & auVar128 | auVar119;
                auVar100 = packssdw(auVar119,auVar119);
                auVar100 = packssdw(auVar100 ^ auVar157,auVar100 ^ auVar157);
                if ((auVar100._0_4_ >> 0x10 & 1) != 0) {
                  ptr_06[uVar35 + 2] = auVar165._4_2_;
                }
                auVar100 = (auVar169 | _DAT_00903a80) ^ auVar115;
                iVar135 = -(uint)(iVar173 < auVar100._0_4_);
                auVar136._4_4_ = -(uint)(iVar177 < auVar100._4_4_);
                iVar144 = -(uint)(iVar180 < auVar100._8_4_);
                auVar136._12_4_ = -(uint)(iVar183 < auVar100._12_4_);
                auVar120._4_4_ = iVar135;
                auVar120._0_4_ = iVar135;
                auVar120._8_4_ = iVar144;
                auVar120._12_4_ = iVar144;
                iVar135 = -(uint)(auVar100._4_4_ == iVar177);
                iVar144 = -(uint)(auVar100._12_4_ == iVar183);
                auVar129._4_4_ = iVar135;
                auVar129._0_4_ = iVar135;
                auVar129._8_4_ = iVar144;
                auVar129._12_4_ = iVar144;
                auVar136._0_4_ = auVar136._4_4_;
                auVar136._8_4_ = auVar136._12_4_;
                auVar100 = auVar129 & auVar120 | auVar136;
                auVar100 = packssdw(auVar100,auVar100);
                auVar100 = packssdw(auVar100 ^ auVar157,auVar100 ^ auVar157);
                if ((auVar100 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  ptr_06[uVar35 + 3] = auVar165._8_2_;
                }
                auVar100 = pshufhw(auVar100,auVar120,0x84);
                auVar121 = pshufhw(auVar120,auVar129,0x84);
                auVar185 = pshufhw(auVar100,auVar136,0x84);
                auVar100 = (auVar185 | auVar121 & auVar100) ^ auVar157;
                auVar100 = packssdw(auVar100,auVar100);
                if ((auVar100 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  ptr_06[uVar35 + 4] = auVar165._12_2_;
                }
                auVar69._4_4_ = uVar117;
                auVar69._0_4_ = uVar117;
                auVar69._8_4_ = uVar117;
                auVar69._12_4_ = uVar117;
                auVar69 = auVar69 | _DAT_00904a90;
                iVar135 = auVar69._4_4_;
                auVar130._4_4_ = iVar135;
                auVar130._0_4_ = iVar135;
                auVar130._8_4_ = auVar69._12_4_;
                auVar130._12_4_ = auVar69._12_4_;
                auVar131._0_4_ = uVar48 - auVar69._0_4_ * gap;
                auVar131._4_4_ = uVar48 - iVar135 * gap;
                auVar131._8_4_ = uVar48 - (int)((auVar69._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                auVar131._12_4_ = uVar48 - (int)((auVar130._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                auVar186._0_4_ = -(uint)(iVar37 < auVar131._0_4_);
                auVar186._4_4_ = -(uint)(iVar104 < auVar131._4_4_);
                auVar186._8_4_ = -(uint)(iVar107 < auVar131._8_4_);
                auVar186._12_4_ = -(uint)(iVar111 < auVar131._12_4_);
                in_XMM15 = ~auVar186 & auVar72 | auVar131 & auVar186;
                auVar100 = (auVar169 | _DAT_00903ad0) ^ auVar115;
                auVar70._0_4_ = -(uint)(iVar173 < auVar100._0_4_);
                auVar70._4_4_ = -(uint)(iVar177 < auVar100._4_4_);
                auVar70._8_4_ = -(uint)(iVar180 < auVar100._8_4_);
                auVar70._12_4_ = -(uint)(iVar183 < auVar100._12_4_);
                auVar132._4_4_ = auVar70._0_4_;
                auVar132._0_4_ = auVar70._0_4_;
                auVar132._8_4_ = auVar70._8_4_;
                auVar132._12_4_ = auVar70._8_4_;
                auVar185 = pshuflw(auVar136,auVar132,0xe8);
                auVar122._4_4_ = -(uint)(auVar100._4_4_ == iVar177);
                auVar122._12_4_ = -(uint)(auVar100._12_4_ == iVar183);
                auVar122._0_4_ = auVar122._4_4_;
                auVar122._8_4_ = auVar122._12_4_;
                auVar100 = pshuflw(auVar127,auVar122,0xe8);
                auVar123._4_4_ = auVar70._4_4_;
                auVar123._0_4_ = auVar70._4_4_;
                auVar123._8_4_ = auVar70._12_4_;
                auVar123._12_4_ = auVar70._12_4_;
                auVar127 = pshuflw(auVar70,auVar123,0xe8);
                auVar127 = (auVar127 | auVar100 & auVar185) ^ auVar157;
                auVar127 = packssdw(auVar127,auVar127);
                if ((auVar127 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar35 + 5] = in_XMM15._0_2_;
                }
                auVar123 = auVar122 & auVar132 | auVar123;
                auVar100 = packssdw(auVar123,auVar123);
                auVar127 = packssdw(auVar127,auVar100 ^ auVar157);
                if ((auVar127 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  ptr_06[uVar35 + 6] = in_XMM15._4_2_;
                }
                auVar127 = (auVar169 | _DAT_00903ac0) ^ auVar115;
                auVar71._0_4_ = -(uint)(iVar173 < auVar127._0_4_);
                auVar71._4_4_ = -(uint)(iVar177 < auVar127._4_4_);
                auVar71._8_4_ = -(uint)(iVar180 < auVar127._8_4_);
                auVar71._12_4_ = -(uint)(iVar183 < auVar127._12_4_);
                auVar124._4_4_ = auVar71._0_4_;
                auVar124._0_4_ = auVar71._0_4_;
                auVar124._8_4_ = auVar71._8_4_;
                auVar124._12_4_ = auVar71._8_4_;
                auVar171._0_4_ = -(uint)(auVar127._0_4_ == iVar173);
                auVar171._4_4_ = -(uint)(auVar127._4_4_ == iVar177);
                auVar171._8_4_ = -(uint)(auVar127._8_4_ == iVar180);
                auVar171._12_4_ = -(uint)(auVar127._12_4_ == iVar183);
                auVar133._4_4_ = auVar171._4_4_;
                auVar133._0_4_ = auVar171._4_4_;
                auVar133._8_4_ = auVar171._12_4_;
                auVar133._12_4_ = auVar171._12_4_;
                auVar137._4_4_ = auVar71._4_4_;
                auVar137._0_4_ = auVar71._4_4_;
                auVar137._8_4_ = auVar71._12_4_;
                auVar137._12_4_ = auVar71._12_4_;
                auVar145 = auVar133 & auVar124 | auVar137;
                auVar127 = packssdw(auVar71,auVar145);
                auVar127 = packssdw(auVar127 ^ auVar157,auVar127 ^ auVar157);
                if ((auVar127 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  ptr_06[uVar35 + 7] = in_XMM15._8_2_;
                }
                auVar127 = pshufhw(auVar127,auVar124,0x84);
                auVar185 = pshufhw(auVar124,auVar133,0x84);
                auVar100 = pshufhw(auVar127,auVar137,0x84);
                auVar127 = (auVar100 | auVar185 & auVar127) ^ auVar157;
                auVar127 = packssdw(auVar127,auVar127);
                if ((auVar127 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  ptr_06[uVar35 + 8] = in_XMM15._12_2_;
                }
                uVar35 = uVar35 + 8;
                iVar32 = iVar32 + gap * -8;
                uVar36 = uVar36 + gap * -8;
                iVar44 = iVar44 + gap * 8;
              } while ((s2Len + 7U & 0xfffffff8) != uVar35);
              local_f8 = uVar51 << 0x10;
              uStack_f0 = uVar51 << 0x10 | uVar51 >> 0x10;
              lVar34 = uVar47 * 0x10;
              local_168._4_2_ = local_78;
              local_168._0_4_ = auVar55._0_4_;
              local_168._6_2_ = sStack_76;
              uStack_160._4_2_ = local_78;
              uStack_160._0_4_ = auVar55._0_4_;
              uStack_160._6_2_ = sStack_76;
              auVar187._4_4_ = uVar42;
              auVar187._0_4_ = uVar42;
              auVar187._8_4_ = uVar42;
              auVar187._12_4_ = uVar42;
              uStack_f4 = (undefined4)(CONCAT44(uVar51,uVar51) >> 0x10);
              uStack_ec = (undefined4)(CONCAT44(uVar51,uVar51) >> 0x10);
              uVar35 = 0;
              uVar172 = local_118;
              uVar175 = uStack_116;
              uVar176 = local_118;
              uVar178 = uStack_116;
              uVar179 = local_118;
              uVar181 = uStack_116;
              uVar182 = local_118;
              uVar184 = uStack_116;
              do {
                uVar63 = ptr[uVar81][0];
                uVar108 = b_03[uVar81][0];
                uVar94 = b_04[uVar81][0];
                uVar80 = b_05[uVar81][0];
                auVar166._0_8_ = uVar108 << 0x10;
                auVar166._8_8_ = b_03[uVar81][1] << 0x10 | uVar108 >> 0x30;
                auVar158._0_8_ = uVar94 << 0x10;
                auVar158._8_8_ = b_04[uVar81][1] << 0x10 | uVar94 >> 0x30;
                auVar146._0_8_ = uVar80 << 0x10;
                auVar146._8_8_ = b_05[uVar81][1] << 0x10 | uVar80 >> 0x30;
                auVar154._8_8_ = ptr[uVar81][1] << 0x10 | uVar63 >> 0x30;
                auVar154._0_8_ = uVar63 << 0x10 | (ulong)(ushort)ptr_06[uVar35];
                lVar45 = uVar47 * (long)ppVar5->mapper[(byte)s2[uVar35]] * 0x10;
                local_218._4_2_ = local_118;
                local_218._0_4_ = auVar54._0_4_;
                local_218._6_2_ = uStack_116;
                local_218._8_2_ = local_118;
                local_218._10_2_ = uStack_116;
                local_218._12_2_ = local_118;
                local_218._14_2_ = uStack_116;
                auVar138 = psubsw(local_218,(undefined1  [16])*ptr_04);
                auVar115 = (undefined1  [16])0x0;
                lVar39 = 0;
                auVar127 = (undefined1  [16])0x0;
                auVar55 = (undefined1  [16])0x0;
                do {
                  auVar100 = *(undefined1 (*) [16])((long)*ptr + lVar39);
                  auVar72 = psubsw(auVar100,auVar187);
                  auVar26._4_4_ = uVar50;
                  auVar26._0_4_ = uVar50;
                  auVar26._8_4_ = uVar50;
                  auVar26._12_4_ = uVar50;
                  auVar185 = psubsw(*(undefined1 (*) [16])((long)*b + lVar39),auVar26);
                  sVar49 = auVar72._0_2_;
                  sVar85 = auVar185._0_2_;
                  auVar56._0_2_ = -(ushort)(sVar85 < sVar49);
                  sVar58 = auVar72._2_2_;
                  sVar90 = auVar185._2_2_;
                  auVar56._2_2_ = -(ushort)(sVar90 < sVar58);
                  sVar59 = auVar72._4_2_;
                  sVar91 = auVar185._4_2_;
                  auVar56._4_2_ = -(ushort)(sVar91 < sVar59);
                  sVar60 = auVar72._6_2_;
                  sVar92 = auVar185._6_2_;
                  auVar56._6_2_ = -(ushort)(sVar92 < sVar60);
                  sVar61 = auVar72._8_2_;
                  sVar93 = auVar185._8_2_;
                  auVar56._8_2_ = -(ushort)(sVar93 < sVar61);
                  sVar64 = auVar72._10_2_;
                  sVar95 = auVar185._10_2_;
                  auVar56._10_2_ = -(ushort)(sVar95 < sVar64);
                  sVar65 = auVar72._12_2_;
                  sVar96 = auVar185._12_2_;
                  sVar66 = auVar72._14_2_;
                  auVar56._12_2_ = -(ushort)(sVar96 < sVar65);
                  sVar97 = auVar185._14_2_;
                  auVar56._14_2_ = -(ushort)(sVar97 < sVar66);
                  uVar98 = (ushort)(sVar85 < sVar49) * sVar49 | (ushort)(sVar85 >= sVar49) * sVar85;
                  uVar102 = (ushort)(sVar90 < sVar58) * sVar58 | (ushort)(sVar90 >= sVar58) * sVar90
                  ;
                  uVar103 = (ushort)(sVar91 < sVar59) * sVar59 | (ushort)(sVar91 >= sVar59) * sVar91
                  ;
                  uVar105 = (ushort)(sVar92 < sVar60) * sVar60 | (ushort)(sVar92 >= sVar60) * sVar92
                  ;
                  uVar106 = (ushort)(sVar93 < sVar61) * sVar61 | (ushort)(sVar93 >= sVar61) * sVar93
                  ;
                  uVar109 = (ushort)(sVar95 < sVar64) * sVar64 | (ushort)(sVar95 >= sVar64) * sVar95
                  ;
                  uVar110 = (ushort)(sVar96 < sVar65) * sVar65 | (ushort)(sVar96 >= sVar65) * sVar96
                  ;
                  uVar112 = (ushort)(sVar97 < sVar66) * sVar66 | (ushort)(sVar97 >= sVar66) * sVar97
                  ;
                  auVar72 = *(undefined1 (*) [16])((long)*b_03 + lVar39);
                  auVar145 = auVar72 & auVar56 |
                             ~auVar56 & *(undefined1 (*) [16])((long)*b_00 + lVar39);
                  auVar185 = *(undefined1 (*) [16])((long)*b_04 + lVar39);
                  auVar73 = auVar185 & auVar56 |
                            ~auVar56 & *(undefined1 (*) [16])((long)*b_01 + lVar39);
                  auVar121 = *(undefined1 (*) [16])((long)*b_05 + lVar39);
                  auVar57 = *(undefined1 (*) [16])((long)*b_02 + lVar39);
                  auVar139 = paddsw(auVar138,*(undefined1 (*) [16])((long)*ptr_04 + lVar39));
                  sVar49 = auVar139._0_2_;
                  auVar140._0_2_ = -(ushort)((short)local_218._0_2_ < sVar49);
                  sVar58 = auVar139._2_2_;
                  auVar140._2_2_ = -(ushort)((short)local_218._2_2_ < sVar58);
                  sVar59 = auVar139._4_2_;
                  auVar140._4_2_ = -(ushort)((short)local_218._4_2_ < sVar59);
                  sVar60 = auVar139._6_2_;
                  auVar140._6_2_ = -(ushort)((short)local_218._6_2_ < sVar60);
                  sVar61 = auVar139._8_2_;
                  auVar140._8_2_ = -(ushort)((short)local_218._8_2_ < sVar61);
                  sVar64 = auVar139._10_2_;
                  auVar140._10_2_ = -(ushort)((short)local_218._10_2_ < sVar64);
                  sVar65 = auVar139._12_2_;
                  sVar66 = auVar139._14_2_;
                  auVar140._12_2_ = -(ushort)((short)local_218._12_2_ < sVar65);
                  auVar140._14_2_ = -(ushort)((short)local_218._14_2_ < sVar66);
                  local_218._0_2_ =
                       (ushort)(sVar49 < (short)local_218._0_2_) * local_218._0_2_ |
                       (ushort)(sVar49 >= (short)local_218._0_2_) * sVar49;
                  local_218._2_2_ =
                       (ushort)(sVar58 < (short)local_218._2_2_) * local_218._2_2_ |
                       (ushort)(sVar58 >= (short)local_218._2_2_) * sVar58;
                  local_218._4_2_ =
                       (ushort)(sVar59 < (short)local_218._4_2_) * local_218._4_2_ |
                       (ushort)(sVar59 >= (short)local_218._4_2_) * sVar59;
                  local_218._6_2_ =
                       (ushort)(sVar60 < (short)local_218._6_2_) * local_218._6_2_ |
                       (ushort)(sVar60 >= (short)local_218._6_2_) * sVar60;
                  local_218._8_2_ =
                       (ushort)(sVar61 < (short)local_218._8_2_) * local_218._8_2_ |
                       (ushort)(sVar61 >= (short)local_218._8_2_) * sVar61;
                  local_218._10_2_ =
                       (ushort)(sVar64 < (short)local_218._10_2_) * local_218._10_2_ |
                       (ushort)(sVar64 >= (short)local_218._10_2_) * sVar64;
                  local_218._12_2_ =
                       (ushort)(sVar65 < (short)local_218._12_2_) * local_218._12_2_ |
                       (ushort)(sVar65 >= (short)local_218._12_2_) * sVar65;
                  local_218._14_2_ =
                       (ushort)(sVar66 < (short)local_218._14_2_) * local_218._14_2_ |
                       (ushort)(sVar66 >= (short)local_218._14_2_) * sVar66;
                  auVar55 = local_1e8 & auVar140 | ~auVar140 & auVar55;
                  auVar127 = auVar113 & auVar140 | ~auVar140 & auVar127;
                  auVar139 = paddsw(auVar171,*(undefined1 (*) [16])((long)*ptr_05 + lVar39));
                  auVar115 = ~auVar140 & auVar115 | auVar139 & auVar140;
                  auVar139 = paddsw(auVar154,*(undefined1 (*) [16])((long)pvVar4 + lVar39 + lVar45))
                  ;
                  auVar167 = paddsw(auVar166,*(undefined1 (*) [16])((long)pvVar6 + lVar39 + lVar45))
                  ;
                  auVar159 = paddsw(auVar158,*(undefined1 (*) [16])((long)pvVar7 + lVar39 + lVar45))
                  ;
                  sVar49 = auVar139._0_2_;
                  auVar170._0_2_ = -(ushort)(sVar49 < (short)uVar98);
                  sVar58 = auVar139._2_2_;
                  auVar170._2_2_ = -(ushort)(sVar58 < (short)uVar102);
                  sVar59 = auVar139._4_2_;
                  auVar170._4_2_ = -(ushort)(sVar59 < (short)uVar103);
                  sVar60 = auVar139._6_2_;
                  auVar170._6_2_ = -(ushort)(sVar60 < (short)uVar105);
                  sVar61 = auVar139._8_2_;
                  auVar170._8_2_ = -(ushort)(sVar61 < (short)uVar106);
                  sVar64 = auVar139._10_2_;
                  auVar170._10_2_ = -(ushort)(sVar64 < (short)uVar109);
                  sVar65 = auVar139._12_2_;
                  auVar170._12_2_ = -(ushort)(sVar65 < (short)uVar110);
                  sVar66 = auVar139._14_2_;
                  auVar170._14_2_ = -(ushort)(sVar66 < (short)uVar112);
                  puVar1 = (ushort *)((long)*b + lVar39);
                  *puVar1 = uVar98;
                  puVar1[1] = uVar102;
                  puVar1[2] = uVar103;
                  puVar1[3] = uVar105;
                  puVar1[4] = uVar106;
                  puVar1[5] = uVar109;
                  puVar1[6] = uVar110;
                  puVar1[7] = uVar112;
                  *(undefined1 (*) [16])((long)*b_00 + lVar39) = auVar145;
                  local_1e8 = ~auVar170 & auVar167 | auVar145 & auVar170;
                  *(undefined1 (*) [16])((long)*b_01 + lVar39) = auVar73;
                  auVar113 = ~auVar170 & auVar159 | auVar73 & auVar170;
                  auVar57 = paddsw(~auVar56 & auVar57 | auVar121 & auVar56,_DAT_00904d10);
                  auVar73 = paddsw(auVar146,_DAT_00904d10);
                  *(undefined1 (*) [16])((long)*b_02 + lVar39) = auVar57;
                  auVar171 = ~auVar170 & auVar73 | auVar57 & auVar170;
                  uVar98 = (ushort)((short)uVar98 < sVar49) * sVar49 |
                           ((short)uVar98 >= sVar49) * uVar98;
                  uVar102 = (ushort)((short)uVar102 < sVar58) * sVar58 |
                            ((short)uVar102 >= sVar58) * uVar102;
                  uVar103 = (ushort)((short)uVar103 < sVar59) * sVar59 |
                            ((short)uVar103 >= sVar59) * uVar103;
                  uVar105 = (ushort)((short)uVar105 < sVar60) * sVar60 |
                            ((short)uVar105 >= sVar60) * uVar105;
                  auVar138._0_8_ = CONCAT26(uVar105,CONCAT24(uVar103,CONCAT22(uVar102,uVar98)));
                  auVar138._8_2_ =
                       (ushort)((short)uVar106 < sVar61) * sVar61 |
                       ((short)uVar106 >= sVar61) * uVar106;
                  auVar138._10_2_ =
                       (ushort)((short)uVar109 < sVar64) * sVar64 |
                       ((short)uVar109 >= sVar64) * uVar109;
                  auVar138._12_2_ =
                       (ushort)((short)uVar110 < sVar65) * sVar65 |
                       ((short)uVar110 >= sVar65) * uVar110;
                  auVar138._14_2_ =
                       (ushort)((short)uVar112 < sVar66) * sVar66 |
                       ((short)uVar112 >= sVar66) * uVar112;
                  *(undefined1 (*) [16])((long)*ptr + lVar39) = auVar139;
                  *(undefined1 (*) [16])((long)*b_03 + lVar39) = auVar167;
                  *(undefined1 (*) [16])((long)*b_04 + lVar39) = auVar159;
                  *(undefined1 (*) [16])((long)*b_05 + lVar39) = auVar73;
                  lVar39 = lVar39 + 0x10;
                  auVar146 = auVar121;
                  auVar154 = auVar100;
                  auVar158 = auVar185;
                  auVar166 = auVar72;
                } while (lVar34 != lVar39);
                lVar39 = local_1e8._8_8_;
                uVar63 = local_1e8._0_8_;
                local_1e8._0_8_ = uVar63 << 0x10;
                local_1e8._8_8_ = lVar39 << 0x10 | uVar63 >> 0x30;
                lVar39 = auVar113._8_8_;
                uVar63 = auVar113._0_8_;
                auVar113._0_8_ = uVar63 << 0x10;
                auVar113._8_8_ = lVar39 << 0x10 | uVar63 >> 0x30;
                lVar39 = auVar171._8_8_;
                uVar63 = auVar171._0_8_;
                auVar171._0_8_ = uVar63 << 0x10;
                auVar171._8_8_ = lVar39 << 0x10 | uVar63 >> 0x30;
                auVar141._8_8_ = auVar138._8_8_ << 0x10 | (ulong)uVar105;
                uVar106 = ptr_06[uVar35 + 1];
                auVar141._0_8_ = auVar138._0_8_ << 0x10 | (ulong)uVar106;
                uVar63 = uVar35 + 1;
                auVar100 = paddsw((undefined1  [16])*ptr_04,auVar141);
                sVar49 = auVar100._0_2_;
                auVar147._0_2_ = -(ushort)(sVar49 < (short)local_218._0_2_);
                sVar58 = auVar100._2_2_;
                auVar147._2_2_ = -(ushort)(sVar58 < (short)local_218._2_2_);
                sVar59 = auVar100._4_2_;
                auVar147._4_2_ = -(ushort)(sVar59 < (short)local_218._4_2_);
                sVar60 = auVar100._6_2_;
                auVar147._6_2_ = -(ushort)(sVar60 < (short)local_218._6_2_);
                sVar61 = auVar100._8_2_;
                auVar147._8_2_ = -(ushort)(sVar61 < (short)local_218._8_2_);
                sVar64 = auVar100._10_2_;
                auVar147._10_2_ = -(ushort)(sVar64 < (short)local_218._10_2_);
                sVar65 = auVar100._12_2_;
                auVar147._12_2_ = -(ushort)(sVar65 < (short)local_218._12_2_);
                sVar66 = auVar100._14_2_;
                auVar147._14_2_ = -(ushort)(sVar66 < (short)local_218._14_2_);
                auVar160._0_2_ =
                     (ushort)(sVar49 < (short)local_218._0_2_) * local_218._0_2_ |
                     (ushort)(sVar49 >= (short)local_218._0_2_) * sVar49;
                auVar160._2_2_ =
                     (ushort)(sVar58 < (short)local_218._2_2_) * local_218._2_2_ |
                     (ushort)(sVar58 >= (short)local_218._2_2_) * sVar58;
                auVar160._4_2_ =
                     (ushort)(sVar59 < (short)local_218._4_2_) * local_218._4_2_ |
                     (ushort)(sVar59 >= (short)local_218._4_2_) * sVar59;
                auVar160._6_2_ =
                     (ushort)(sVar60 < (short)local_218._6_2_) * local_218._6_2_ |
                     (ushort)(sVar60 >= (short)local_218._6_2_) * sVar60;
                auVar160._8_2_ =
                     (ushort)(sVar61 < (short)local_218._8_2_) * local_218._8_2_ |
                     (ushort)(sVar61 >= (short)local_218._8_2_) * sVar61;
                auVar160._10_2_ =
                     (ushort)(sVar64 < (short)local_218._10_2_) * local_218._10_2_ |
                     (ushort)(sVar64 >= (short)local_218._10_2_) * sVar64;
                auVar160._12_2_ =
                     (ushort)(sVar65 < (short)local_218._12_2_) * local_218._12_2_ |
                     (ushort)(sVar65 >= (short)local_218._12_2_) * sVar65;
                auVar160._14_2_ =
                     (ushort)(sVar66 < (short)local_218._14_2_) * local_218._14_2_ |
                     (ushort)(sVar66 >= (short)local_218._14_2_) * sVar66;
                auVar100 = auVar55 & auVar147 | ~auVar147 & local_1e8;
                auVar55 = auVar127 & auVar147 | ~auVar147 & auVar113;
                auVar127 = paddsw((undefined1  [16])*ptr_05,auVar171);
                auVar115 = ~auVar147 & auVar127 | auVar115 & auVar147;
                iVar37 = 6;
                auVar28._4_4_ = uStack_f4;
                auVar28._0_4_ = local_f8;
                auVar28._8_4_ = uStack_f0;
                auVar28._12_4_ = uStack_ec;
                do {
                  auVar148._0_8_ = auVar115._0_8_ << 0x10;
                  auVar148._8_8_ = auVar115._8_8_ << 0x10 | auVar115._0_8_ >> 0x30;
                  auVar72 = paddsw(auVar148,auVar28);
                  auVar87._0_8_ = auVar160._0_8_ << 0x10;
                  auVar87._8_8_ = auVar160._8_8_ << 0x10 | auVar160._0_8_ >> 0x30;
                  auVar127 = paddsw(auVar87,auVar126);
                  sVar49 = auVar127._0_2_;
                  sVar85 = auVar160._0_2_;
                  sVar58 = auVar127._2_2_;
                  sVar90 = auVar160._2_2_;
                  sVar59 = auVar127._4_2_;
                  sVar91 = auVar160._4_2_;
                  sVar60 = auVar127._6_2_;
                  sVar92 = auVar160._6_2_;
                  uVar109 = (ushort)(sVar92 < sVar60) * sVar60 | (ushort)(sVar92 >= sVar60) * sVar92
                  ;
                  auVar161._0_8_ =
                       CONCAT26(uVar109,CONCAT24((ushort)(sVar91 < sVar59) * sVar59 |
                                                 (ushort)(sVar91 >= sVar59) * sVar91,
                                                 CONCAT22((ushort)(sVar90 < sVar58) * sVar58 |
                                                          (ushort)(sVar90 >= sVar58) * sVar90,
                                                          (ushort)(sVar85 < sVar49) * sVar49 |
                                                          (ushort)(sVar85 >= sVar49) * sVar85)));
                  sVar61 = auVar127._8_2_;
                  sVar93 = auVar160._8_2_;
                  auVar161._8_2_ =
                       (ushort)(sVar93 < sVar61) * sVar61 | (ushort)(sVar93 >= sVar61) * sVar93;
                  sVar64 = auVar127._10_2_;
                  sVar95 = auVar160._10_2_;
                  auVar161._10_2_ =
                       (ushort)(sVar95 < sVar64) * sVar64 | (ushort)(sVar95 >= sVar64) * sVar95;
                  sVar65 = auVar127._12_2_;
                  sVar96 = auVar160._12_2_;
                  sVar97 = auVar160._14_2_;
                  auVar161._12_2_ =
                       (ushort)(sVar96 < sVar65) * sVar65 | (ushort)(sVar96 >= sVar65) * sVar96;
                  sVar66 = auVar127._14_2_;
                  auVar161._14_2_ =
                       (ushort)(sVar97 < sVar66) * sVar66 | (ushort)(sVar97 >= sVar66) * sVar97;
                  auVar74._0_2_ = -(ushort)(sVar49 < sVar85);
                  auVar74._2_2_ = -(ushort)(sVar58 < sVar90);
                  auVar74._4_2_ = -(ushort)(sVar59 < sVar91);
                  auVar74._6_2_ = -(ushort)(sVar60 < sVar92);
                  auVar74._8_2_ = -(ushort)(sVar61 < sVar93);
                  auVar74._10_2_ = -(ushort)(sVar64 < sVar95);
                  auVar74._12_2_ = -(ushort)(sVar65 < sVar96);
                  auVar74._14_2_ = -(ushort)(sVar66 < sVar97);
                  auVar88._0_8_ = auVar100._0_8_ << 0x10;
                  auVar88._8_8_ = auVar100._8_8_ << 0x10 | auVar100._0_8_ >> 0x30;
                  auVar100 = auVar100 & auVar74 | ~auVar74 & auVar88;
                  auVar89._0_8_ = auVar55._0_8_ << 0x10;
                  auVar89._8_8_ = auVar55._8_8_ << 0x10 | auVar55._0_8_ >> 0x30;
                  auVar55 = auVar55 & auVar74 | ~auVar74 & auVar89;
                  auVar115 = ~auVar74 & auVar72 | auVar115 & auVar74;
                  iVar37 = iVar37 + -1;
                  auVar160 = auVar161;
                } while (iVar37 != 0);
                auVar149._0_8_ = auVar115._0_8_ << 0x10;
                auVar149._8_8_ = auVar115._8_8_ << 0x10 | auVar115._0_8_ >> 0x30;
                auVar162._0_8_ = auVar161._0_8_ << 0x10;
                auVar162._8_8_ = auVar161._8_8_ << 0x10 | (ulong)uVar109;
                auVar163 = paddsw(auVar162,ZEXT416(uVar31 & 0xffff));
                sVar49 = auVar163._0_2_;
                auVar168._0_2_ = -(ushort)((short)uVar106 < sVar49);
                sVar58 = auVar163._2_2_;
                auVar168._2_2_ = -(ushort)((short)uVar98 < sVar58);
                sVar59 = auVar163._4_2_;
                auVar168._4_2_ = -(ushort)((short)uVar102 < sVar59);
                sVar60 = auVar163._6_2_;
                auVar168._6_2_ = -(ushort)((short)uVar103 < sVar60);
                sVar61 = auVar163._8_2_;
                auVar168._8_2_ = -(ushort)((short)uVar105 < sVar61);
                sVar64 = auVar163._10_2_;
                auVar168._10_2_ = -(ushort)((short)auVar138._8_2_ < sVar64);
                sVar65 = auVar163._12_2_;
                sVar66 = auVar163._14_2_;
                auVar168._12_2_ = -(ushort)((short)auVar138._10_2_ < sVar65);
                auVar168._14_2_ = -(ushort)((short)auVar138._12_2_ < sVar66);
                auVar142._0_2_ =
                     (ushort)((short)uVar106 < sVar49) * sVar49 |
                     ((short)uVar106 >= sVar49) * uVar106;
                auVar142._2_2_ =
                     (ushort)((short)uVar98 < sVar58) * sVar58 | ((short)uVar98 >= sVar58) * uVar98;
                auVar142._4_2_ =
                     (ushort)((short)uVar102 < sVar59) * sVar59 |
                     ((short)uVar102 >= sVar59) * uVar102;
                auVar142._6_2_ =
                     (ushort)((short)uVar103 < sVar60) * sVar60 |
                     ((short)uVar103 >= sVar60) * uVar103;
                auVar142._8_2_ =
                     (ushort)((short)uVar105 < sVar61) * sVar61 |
                     ((short)uVar105 >= sVar61) * uVar105;
                auVar142._10_2_ =
                     (ushort)((short)auVar138._8_2_ < sVar64) * sVar64 |
                     ((short)auVar138._8_2_ >= sVar64) * auVar138._8_2_;
                auVar142._12_2_ =
                     (ushort)((short)auVar138._10_2_ < sVar65) * sVar65 |
                     ((short)auVar138._10_2_ >= sVar65) * auVar138._10_2_;
                auVar142._14_2_ =
                     (ushort)((short)auVar138._12_2_ < sVar66) * sVar66 |
                     ((short)auVar138._12_2_ >= sVar66) * auVar138._12_2_;
                auVar134._0_8_ = auVar100._0_8_ << 0x10;
                auVar134._8_8_ = auVar100._8_8_ << 0x10 | auVar100._0_8_ >> 0x30;
                auVar100 = auVar134 & auVar168 | ~auVar168 & local_1e8;
                auVar125._0_8_ = auVar55._0_8_ << 0x10;
                auVar125._8_8_ = auVar55._8_8_ << 0x10 | auVar55._0_8_ >> 0x30;
                auVar115 = auVar125 & auVar168 | ~auVar168 & auVar113;
                auVar127 = ~auVar168 & auVar171 | auVar149 & auVar168;
                lVar39 = 0;
                do {
                  puVar1 = (ushort *)((long)*ptr + lVar39);
                  uVar98 = *puVar1;
                  uVar102 = puVar1[1];
                  uVar103 = puVar1[2];
                  uVar105 = puVar1[3];
                  uVar106 = puVar1[4];
                  uVar109 = puVar1[5];
                  uVar110 = puVar1[6];
                  uVar112 = puVar1[7];
                  auVar55 = psubsw(auVar142,auVar187);
                  auVar27._4_4_ = uVar50;
                  auVar27._0_4_ = uVar50;
                  auVar27._8_4_ = uVar50;
                  auVar27._12_4_ = uVar50;
                  auVar72 = psubsw(auVar163,auVar27);
                  sVar49 = auVar72._0_2_;
                  sVar85 = auVar55._0_2_;
                  auVar163._0_2_ =
                       (ushort)(sVar85 < sVar49) * sVar49 | (ushort)(sVar85 >= sVar49) * sVar85;
                  sVar58 = auVar72._2_2_;
                  sVar90 = auVar55._2_2_;
                  auVar163._2_2_ =
                       (ushort)(sVar90 < sVar58) * sVar58 | (ushort)(sVar90 >= sVar58) * sVar90;
                  sVar59 = auVar72._4_2_;
                  sVar91 = auVar55._4_2_;
                  auVar163._4_2_ =
                       (ushort)(sVar91 < sVar59) * sVar59 | (ushort)(sVar91 >= sVar59) * sVar91;
                  sVar60 = auVar72._6_2_;
                  sVar92 = auVar55._6_2_;
                  auVar163._6_2_ =
                       (ushort)(sVar92 < sVar60) * sVar60 | (ushort)(sVar92 >= sVar60) * sVar92;
                  sVar61 = auVar72._8_2_;
                  sVar93 = auVar55._8_2_;
                  auVar163._8_2_ =
                       (ushort)(sVar93 < sVar61) * sVar61 | (ushort)(sVar93 >= sVar61) * sVar93;
                  sVar64 = auVar72._10_2_;
                  sVar95 = auVar55._10_2_;
                  auVar163._10_2_ =
                       (ushort)(sVar95 < sVar64) * sVar64 | (ushort)(sVar95 >= sVar64) * sVar95;
                  sVar65 = auVar72._12_2_;
                  sVar96 = auVar55._12_2_;
                  sVar97 = auVar55._14_2_;
                  auVar163._12_2_ =
                       (ushort)(sVar96 < sVar65) * sVar65 | (ushort)(sVar96 >= sVar65) * sVar96;
                  sVar66 = auVar72._14_2_;
                  auVar163._14_2_ =
                       (ushort)(sVar97 < sVar66) * sVar66 | (ushort)(sVar97 >= sVar66) * sVar97;
                  auVar143._0_2_ = -(ushort)(sVar49 < sVar85);
                  auVar143._2_2_ = -(ushort)(sVar58 < sVar90);
                  auVar143._4_2_ = -(ushort)(sVar59 < sVar91);
                  auVar143._6_2_ = -(ushort)(sVar60 < sVar92);
                  auVar143._8_2_ = -(ushort)(sVar61 < sVar93);
                  auVar143._10_2_ = -(ushort)(sVar64 < sVar95);
                  auVar143._12_2_ = -(ushort)(sVar65 < sVar96);
                  auVar143._14_2_ = -(ushort)(sVar66 < sVar97);
                  auVar134 = auVar100 & auVar143 | ~auVar143 & auVar134;
                  auVar125 = auVar115 & auVar143 | ~auVar143 & auVar125;
                  auVar149 = paddsw(~auVar143 & auVar149 | auVar127 & auVar143,_DAT_00904d10);
                  psVar2 = (short *)((long)*b + lVar39);
                  sVar49 = *psVar2;
                  sVar58 = psVar2[1];
                  sVar59 = psVar2[2];
                  sVar60 = psVar2[3];
                  sVar61 = psVar2[4];
                  sVar64 = psVar2[5];
                  sVar65 = psVar2[6];
                  sVar66 = psVar2[7];
                  uVar67 = (sVar49 < (short)uVar98) * uVar98 |
                           (ushort)(sVar49 >= (short)uVar98) * sVar49;
                  uVar76 = (sVar58 < (short)uVar102) * uVar102 |
                           (ushort)(sVar58 >= (short)uVar102) * sVar58;
                  uVar77 = (sVar59 < (short)uVar103) * uVar103 |
                           (ushort)(sVar59 >= (short)uVar103) * sVar59;
                  uVar78 = (sVar60 < (short)uVar105) * uVar105 |
                           (ushort)(sVar60 >= (short)uVar105) * sVar60;
                  uVar79 = (sVar61 < (short)uVar106) * uVar106 |
                           (ushort)(sVar61 >= (short)uVar106) * sVar61;
                  uVar82 = (sVar64 < (short)uVar109) * uVar109 |
                           (ushort)(sVar64 >= (short)uVar109) * sVar64;
                  uVar83 = (sVar65 < (short)uVar110) * uVar110 |
                           (ushort)(sVar65 >= (short)uVar110) * sVar65;
                  uVar84 = (sVar66 < (short)uVar112) * uVar112 |
                           (ushort)(sVar66 >= (short)uVar112) * sVar66;
                  auVar142._0_2_ =
                       ((short)uVar67 < (short)auVar163._0_2_) * auVar163._0_2_ |
                       ((short)uVar67 >= (short)auVar163._0_2_) * uVar67;
                  auVar142._2_2_ =
                       ((short)uVar76 < (short)auVar163._2_2_) * auVar163._2_2_ |
                       ((short)uVar76 >= (short)auVar163._2_2_) * uVar76;
                  auVar142._4_2_ =
                       ((short)uVar77 < (short)auVar163._4_2_) * auVar163._4_2_ |
                       ((short)uVar77 >= (short)auVar163._4_2_) * uVar77;
                  auVar142._6_2_ =
                       ((short)uVar78 < (short)auVar163._6_2_) * auVar163._6_2_ |
                       ((short)uVar78 >= (short)auVar163._6_2_) * uVar78;
                  auVar142._8_2_ =
                       ((short)uVar79 < (short)auVar163._8_2_) * auVar163._8_2_ |
                       ((short)uVar79 >= (short)auVar163._8_2_) * uVar79;
                  auVar142._10_2_ =
                       ((short)uVar82 < (short)auVar163._10_2_) * auVar163._10_2_ |
                       ((short)uVar82 >= (short)auVar163._10_2_) * uVar82;
                  auVar142._12_2_ =
                       ((short)uVar83 < (short)auVar163._12_2_) * auVar163._12_2_ |
                       ((short)uVar83 >= (short)auVar163._12_2_) * uVar83;
                  auVar142._14_2_ =
                       ((short)uVar84 < (short)auVar163._14_2_) * auVar163._14_2_ |
                       ((short)uVar84 >= (short)auVar163._14_2_) * uVar84;
                  auVar101._0_2_ = -(ushort)(uVar98 == auVar142._0_2_);
                  auVar101._2_2_ = -(ushort)(uVar102 == auVar142._2_2_);
                  auVar101._4_2_ = -(ushort)(uVar103 == auVar142._4_2_);
                  auVar101._6_2_ = -(ushort)(uVar105 == auVar142._6_2_);
                  auVar101._8_2_ = -(ushort)(uVar106 == auVar142._8_2_);
                  auVar101._10_2_ = -(ushort)(uVar109 == auVar142._10_2_);
                  auVar101._12_2_ = -(ushort)(uVar110 == auVar142._12_2_);
                  auVar101._14_2_ = -(ushort)(uVar112 == auVar142._14_2_);
                  auVar75._0_2_ = -(ushort)((short)auVar163._0_2_ < (short)uVar67);
                  auVar75._2_2_ = -(ushort)((short)auVar163._2_2_ < (short)uVar76);
                  auVar75._4_2_ = -(ushort)((short)auVar163._4_2_ < (short)uVar77);
                  auVar75._6_2_ = -(ushort)((short)auVar163._6_2_ < (short)uVar78);
                  auVar75._8_2_ = -(ushort)((short)auVar163._8_2_ < (short)uVar79);
                  auVar75._10_2_ = -(ushort)((short)auVar163._10_2_ < (short)uVar82);
                  auVar75._12_2_ = -(ushort)((short)auVar163._12_2_ < (short)uVar83);
                  auVar75._14_2_ = -(ushort)((short)auVar163._14_2_ < (short)uVar84);
                  auVar100 = *(undefined1 (*) [16])((long)*b_03 + lVar39) & auVar101 |
                             ~auVar101 &
                             (~auVar75 & auVar134 |
                             *(undefined1 (*) [16])((long)*b_00 + lVar39) & auVar75);
                  auVar115 = *(undefined1 (*) [16])((long)*b_04 + lVar39) & auVar101 |
                             ~auVar101 &
                             (~auVar75 & auVar125 |
                             *(undefined1 (*) [16])((long)*b_01 + lVar39) & auVar75);
                  auVar127 = auVar101 & *(undefined1 (*) [16])((long)*b_05 + lVar39) |
                             ~auVar101 &
                             (~auVar75 & auVar149 |
                             *(undefined1 (*) [16])((long)*b_02 + lVar39) & auVar75);
                  *(undefined1 (*) [16])((long)*ptr + lVar39) = auVar142;
                  *(undefined1 (*) [16])((long)*b_03 + lVar39) = auVar100;
                  *(undefined1 (*) [16])((long)*b_04 + lVar39) = auVar115;
                  *(undefined1 (*) [16])((long)*b_05 + lVar39) = auVar127;
                  local_168._0_2_ =
                       ((short)auVar142._0_2_ < (short)(ushort)local_168) * auVar142._0_2_ |
                       ((short)auVar142._0_2_ >= (short)(ushort)local_168) * (ushort)local_168;
                  local_168._2_2_ =
                       ((short)auVar142._2_2_ < (short)local_168._2_2_) * auVar142._2_2_ |
                       ((short)auVar142._2_2_ >= (short)local_168._2_2_) * local_168._2_2_;
                  local_168._4_2_ =
                       ((short)auVar142._4_2_ < (short)local_168._4_2_) * auVar142._4_2_ |
                       ((short)auVar142._4_2_ >= (short)local_168._4_2_) * local_168._4_2_;
                  local_168._6_2_ =
                       ((short)auVar142._6_2_ < (short)local_168._6_2_) * auVar142._6_2_ |
                       ((short)auVar142._6_2_ >= (short)local_168._6_2_) * local_168._6_2_;
                  uStack_160._0_2_ =
                       ((short)auVar142._8_2_ < (short)(ushort)uStack_160) * auVar142._8_2_ |
                       ((short)auVar142._8_2_ >= (short)(ushort)uStack_160) * (ushort)uStack_160;
                  uStack_160._2_2_ =
                       ((short)auVar142._10_2_ < (short)uStack_160._2_2_) * auVar142._10_2_ |
                       ((short)auVar142._10_2_ >= (short)uStack_160._2_2_) * uStack_160._2_2_;
                  uStack_160._4_2_ =
                       ((short)auVar142._12_2_ < (short)uStack_160._4_2_) * auVar142._12_2_ |
                       ((short)auVar142._12_2_ >= (short)uStack_160._4_2_) * uStack_160._4_2_;
                  uStack_160._6_2_ =
                       ((short)auVar142._14_2_ < (short)uStack_160._6_2_) * auVar142._14_2_ |
                       ((short)auVar142._14_2_ >= (short)uStack_160._6_2_) * uStack_160._6_2_;
                  uVar172 = ((short)uVar172 < (short)auVar142._0_2_) * auVar142._0_2_ |
                            ((short)uVar172 >= (short)auVar142._0_2_) * uVar172;
                  uVar175 = ((short)uVar175 < (short)auVar142._2_2_) * auVar142._2_2_ |
                            ((short)uVar175 >= (short)auVar142._2_2_) * uVar175;
                  uVar176 = ((short)uVar176 < (short)auVar142._4_2_) * auVar142._4_2_ |
                            ((short)uVar176 >= (short)auVar142._4_2_) * uVar176;
                  uVar178 = ((short)uVar178 < (short)auVar142._6_2_) * auVar142._6_2_ |
                            ((short)uVar178 >= (short)auVar142._6_2_) * uVar178;
                  uVar179 = ((short)uVar179 < (short)auVar142._8_2_) * auVar142._8_2_ |
                            ((short)uVar179 >= (short)auVar142._8_2_) * uVar179;
                  uVar181 = ((short)uVar181 < (short)auVar142._10_2_) * auVar142._10_2_ |
                            ((short)uVar181 >= (short)auVar142._10_2_) * uVar181;
                  uVar182 = ((short)uVar182 < (short)auVar142._12_2_) * auVar142._12_2_ |
                            ((short)uVar182 >= (short)auVar142._12_2_) * uVar182;
                  uVar184 = ((short)uVar184 < (short)auVar142._14_2_) * auVar142._14_2_ |
                            ((short)uVar184 >= (short)auVar142._14_2_) * uVar184;
                  sVar49 = auVar100._0_2_;
                  uVar172 = (ushort)((short)uVar172 < sVar49) * sVar49 |
                            ((short)uVar172 >= sVar49) * uVar172;
                  sVar49 = auVar100._2_2_;
                  uVar175 = (ushort)((short)uVar175 < sVar49) * sVar49 |
                            ((short)uVar175 >= sVar49) * uVar175;
                  sVar49 = auVar100._4_2_;
                  uVar176 = (ushort)((short)uVar176 < sVar49) * sVar49 |
                            ((short)uVar176 >= sVar49) * uVar176;
                  sVar49 = auVar100._6_2_;
                  uVar178 = (ushort)((short)uVar178 < sVar49) * sVar49 |
                            ((short)uVar178 >= sVar49) * uVar178;
                  sVar49 = auVar100._8_2_;
                  uVar179 = (ushort)((short)uVar179 < sVar49) * sVar49 |
                            ((short)uVar179 >= sVar49) * uVar179;
                  sVar49 = auVar100._10_2_;
                  uVar181 = (ushort)((short)uVar181 < sVar49) * sVar49 |
                            ((short)uVar181 >= sVar49) * uVar181;
                  sVar49 = auVar100._12_2_;
                  uVar182 = (ushort)((short)uVar182 < sVar49) * sVar49 |
                            ((short)uVar182 >= sVar49) * uVar182;
                  sVar49 = auVar100._14_2_;
                  uVar184 = (ushort)((short)uVar184 < sVar49) * sVar49 |
                            ((short)uVar184 >= sVar49) * uVar184;
                  sVar49 = auVar127._0_2_;
                  sVar58 = auVar115._0_2_;
                  uVar98 = (ushort)(sVar58 < sVar49) * sVar49 | (ushort)(sVar58 >= sVar49) * sVar58;
                  sVar49 = auVar127._2_2_;
                  sVar58 = auVar115._2_2_;
                  uVar102 = (ushort)(sVar58 < sVar49) * sVar49 | (ushort)(sVar58 >= sVar49) * sVar58
                  ;
                  sVar49 = auVar127._4_2_;
                  sVar58 = auVar115._4_2_;
                  uVar103 = (ushort)(sVar58 < sVar49) * sVar49 | (ushort)(sVar58 >= sVar49) * sVar58
                  ;
                  sVar49 = auVar127._6_2_;
                  sVar58 = auVar115._6_2_;
                  uVar105 = (ushort)(sVar58 < sVar49) * sVar49 | (ushort)(sVar58 >= sVar49) * sVar58
                  ;
                  sVar49 = auVar127._8_2_;
                  sVar58 = auVar115._8_2_;
                  uVar106 = (ushort)(sVar58 < sVar49) * sVar49 | (ushort)(sVar58 >= sVar49) * sVar58
                  ;
                  sVar49 = auVar127._10_2_;
                  sVar58 = auVar115._10_2_;
                  uVar109 = (ushort)(sVar58 < sVar49) * sVar49 | (ushort)(sVar58 >= sVar49) * sVar58
                  ;
                  sVar49 = auVar127._12_2_;
                  sVar58 = auVar115._12_2_;
                  sVar59 = auVar115._14_2_;
                  uVar110 = (ushort)(sVar58 < sVar49) * sVar49 | (ushort)(sVar58 >= sVar49) * sVar58
                  ;
                  sVar49 = auVar127._14_2_;
                  uVar112 = (ushort)(sVar59 < sVar49) * sVar49 | (ushort)(sVar59 >= sVar49) * sVar59
                  ;
                  uVar172 = ((short)uVar98 < (short)uVar172) * uVar172 |
                            ((short)uVar98 >= (short)uVar172) * uVar98;
                  uVar175 = ((short)uVar102 < (short)uVar175) * uVar175 |
                            ((short)uVar102 >= (short)uVar175) * uVar102;
                  uVar176 = ((short)uVar103 < (short)uVar176) * uVar176 |
                            ((short)uVar103 >= (short)uVar176) * uVar103;
                  uVar178 = ((short)uVar105 < (short)uVar178) * uVar178 |
                            ((short)uVar105 >= (short)uVar178) * uVar105;
                  uVar179 = ((short)uVar106 < (short)uVar179) * uVar179 |
                            ((short)uVar106 >= (short)uVar179) * uVar106;
                  uVar181 = ((short)uVar109 < (short)uVar181) * uVar181 |
                            ((short)uVar109 >= (short)uVar181) * uVar109;
                  uVar182 = ((short)uVar110 < (short)uVar182) * uVar182 |
                            ((short)uVar110 >= (short)uVar182) * uVar110;
                  uVar184 = ((short)uVar112 < (short)uVar184) * uVar184 |
                            ((short)uVar112 >= (short)uVar184) * uVar112;
                  lVar39 = lVar39 + 0x10;
                } while (lVar34 != lVar39);
                uVar108 = ptr[uVar53][1];
                uVar94 = b_03[uVar53][1];
                uVar80 = b_04[uVar53][1];
                uVar62 = b_05[uVar53][1];
                if (iVar29 < 7) {
                  iVar37 = 0;
                  uVar99 = ptr[uVar53][0];
                  uVar86 = b_03[uVar53][0];
                  uVar68 = b_04[uVar53][0];
                  uVar52 = b_05[uVar53][0];
                  do {
                    uVar108 = uVar108 << 0x10 | uVar99 >> 0x30;
                    uVar94 = uVar94 << 0x10 | uVar86 >> 0x30;
                    uVar80 = uVar80 << 0x10 | uVar68 >> 0x30;
                    uVar62 = uVar62 << 0x10 | uVar52 >> 0x30;
                    iVar37 = iVar37 + 1;
                    uVar99 = uVar99 << 0x10;
                    uVar86 = uVar86 << 0x10;
                    uVar68 = uVar68 << 0x10;
                    uVar52 = uVar52 << 0x10;
                  } while (iVar37 < 7 - iVar29);
                }
                *(int *)(*((ppVar33->field_4).trace)->trace_del_table + uVar35 * 4) =
                     (int)(short)(uVar108 >> 0x30);
                *(int *)(*(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 8) +
                        uVar35 * 4) = (int)(short)(uVar94 >> 0x30);
                *(int *)(*(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 0x10) +
                        uVar35 * 4) = (int)(short)(uVar80 >> 0x30);
                *(int *)(*(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 0x18) +
                        uVar35 * 4) = (int)(short)(uVar62 >> 0x30);
                uVar35 = uVar63;
              } while (uVar63 != (uint)s2Len);
              uVar35 = (ulong)(uVar40 * 4);
              lVar39 = uVar47 * 8;
              lVar45 = (ulong)(uVar40 * 4) * 3;
              lVar8 = (ulong)(uVar40 * 4) * 5;
              lVar9 = uVar47 * 0x18;
              lVar10 = uVar47 * 0x1c;
              uVar47 = 0;
              do {
                psVar3 = (short *)((long)*ptr + uVar47 * 4);
                sVar49 = psVar3[1];
                sVar58 = psVar3[2];
                sVar59 = psVar3[3];
                sVar60 = psVar3[4];
                sVar61 = psVar3[5];
                sVar64 = psVar3[6];
                sVar65 = psVar3[7];
                psVar2 = (short *)((long)*b_03 + uVar47 * 4);
                sVar66 = *psVar2;
                sVar85 = psVar2[1];
                sVar90 = psVar2[2];
                sVar91 = psVar2[3];
                sVar92 = psVar2[4];
                sVar93 = psVar2[5];
                sVar95 = psVar2[6];
                sVar96 = psVar2[7];
                psVar2 = (short *)((long)*b_04 + uVar47 * 4);
                sVar97 = *psVar2;
                sVar11 = psVar2[1];
                sVar12 = psVar2[2];
                sVar13 = psVar2[3];
                sVar14 = psVar2[4];
                sVar15 = psVar2[5];
                sVar16 = psVar2[6];
                sVar17 = psVar2[7];
                psVar2 = (short *)((long)*b_05 + uVar47 * 4);
                sVar18 = *psVar2;
                sVar19 = psVar2[1];
                sVar20 = psVar2[2];
                sVar21 = psVar2[3];
                sVar22 = psVar2[4];
                sVar23 = psVar2[5];
                sVar24 = psVar2[6];
                sVar25 = psVar2[7];
                lVar46 = *(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 0x20);
                *(int *)(lVar46 + uVar47) = (int)*psVar3;
                lVar46 = lVar46 + uVar47;
                *(int *)(uVar35 + lVar46) = (int)sVar49;
                *(int *)(lVar39 + lVar46) = (int)sVar58;
                *(int *)(lVar45 + lVar46) = (int)sVar59;
                *(int *)(lVar34 + lVar46) = (int)sVar60;
                *(int *)(lVar8 + lVar46) = (int)sVar61;
                *(int *)(lVar9 + lVar46) = (int)sVar64;
                *(int *)(lVar10 + lVar46) = (int)sVar65;
                lVar46 = *(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 0x28);
                *(int *)(lVar46 + uVar47) = (int)sVar66;
                lVar46 = lVar46 + uVar47;
                *(int *)(uVar35 + lVar46) = (int)sVar85;
                *(int *)(lVar39 + lVar46) = (int)sVar90;
                *(int *)(lVar45 + lVar46) = (int)sVar91;
                *(int *)(lVar34 + lVar46) = (int)sVar92;
                *(int *)(lVar8 + lVar46) = (int)sVar93;
                *(int *)(lVar9 + lVar46) = (int)sVar95;
                *(int *)(lVar10 + lVar46) = (int)sVar96;
                lVar46 = *(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 0x30);
                *(int *)(lVar46 + uVar47) = (int)sVar97;
                lVar46 = lVar46 + uVar47;
                *(int *)(uVar35 + lVar46) = (int)sVar11;
                *(int *)(lVar39 + lVar46) = (int)sVar12;
                *(int *)(lVar45 + lVar46) = (int)sVar13;
                *(int *)(lVar34 + lVar46) = (int)sVar14;
                *(int *)(lVar8 + lVar46) = (int)sVar15;
                *(int *)(lVar9 + lVar46) = (int)sVar16;
                *(int *)(lVar10 + lVar46) = (int)sVar17;
                lVar46 = *(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 0x38);
                *(int *)(lVar46 + uVar47) = (int)sVar18;
                lVar46 = lVar46 + uVar47;
                *(int *)(uVar35 + lVar46) = (int)sVar19;
                *(int *)(lVar39 + lVar46) = (int)sVar20;
                *(int *)(lVar45 + lVar46) = (int)sVar21;
                *(int *)(lVar34 + lVar46) = (int)sVar22;
                *(int *)(lVar8 + lVar46) = (int)sVar23;
                *(int *)(lVar9 + lVar46) = (int)sVar24;
                *(int *)(lVar10 + lVar46) = (int)sVar25;
                uVar47 = uVar47 + 4;
              } while (uVar35 != uVar47);
              uVar47 = ptr[uVar53][1];
              uVar35 = b_03[uVar53][1];
              uVar81 = b_04[uVar53][1];
              uVar63 = b_05[uVar53][1];
              if (iVar29 < 7) {
                iVar37 = 0;
                uVar108 = ptr[uVar53][0];
                uVar94 = b_03[uVar53][0];
                uVar80 = b_04[uVar53][0];
                uVar53 = b_05[uVar53][0];
                do {
                  uVar47 = uVar47 << 0x10 | uVar108 >> 0x30;
                  uVar35 = uVar35 << 0x10 | uVar94 >> 0x30;
                  uVar81 = uVar81 << 0x10 | uVar80 >> 0x30;
                  uVar63 = uVar63 << 0x10 | uVar53 >> 0x30;
                  iVar37 = iVar37 + 1;
                  uVar108 = uVar108 << 0x10;
                  uVar94 = uVar94 << 0x10;
                  uVar80 = uVar80 << 0x10;
                  uVar53 = uVar53 << 0x10;
                } while (iVar37 < 7 - iVar29);
              }
              auVar114._0_2_ = -(ushort)((short)(ushort)local_168 < (short)local_118);
              auVar114._2_2_ = -(ushort)((short)local_168._2_2_ < (short)uStack_116);
              auVar114._4_2_ = -(ushort)((short)local_168._4_2_ < (short)local_118);
              auVar114._6_2_ = -(ushort)((short)local_168._6_2_ < (short)uStack_116);
              auVar114._8_2_ = -(ushort)((short)(ushort)uStack_160 < (short)local_118);
              auVar114._10_2_ = -(ushort)((short)uStack_160._2_2_ < (short)uStack_116);
              auVar114._12_2_ = -(ushort)((short)uStack_160._4_2_ < (short)local_118);
              auVar114._14_2_ = -(ushort)((short)uStack_160._6_2_ < (short)uStack_116);
              auVar174._0_2_ = -(ushort)(local_78 < (short)uVar172);
              auVar174._2_2_ = -(ushort)(sStack_76 < (short)uVar175);
              auVar174._4_2_ = -(ushort)(local_78 < (short)uVar176);
              auVar174._6_2_ = -(ushort)(sStack_76 < (short)uVar178);
              auVar174._8_2_ = -(ushort)(local_78 < (short)uVar179);
              auVar174._10_2_ = -(ushort)(sStack_76 < (short)uVar181);
              auVar174._12_2_ = -(ushort)(local_78 < (short)uVar182);
              auVar174._14_2_ = -(ushort)(sStack_76 < (short)uVar184);
              auVar174 = auVar174 | auVar114;
              if ((((((((((((((((auVar174 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar174 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar174 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                              ) && (auVar174 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                            (auVar174 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar174 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar174 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar174 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar174 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar174 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar174 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar174 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar174 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar174 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar174 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar174[0xf]) {
                sVar49 = (short)(uVar47 >> 0x30);
                sVar58 = (short)(uVar35 >> 0x30);
                sVar59 = (short)(uVar81 >> 0x30);
                sVar60 = (short)(uVar63 >> 0x30);
              }
              else {
                *(byte *)&ppVar33->flag = (byte)ppVar33->flag | 0x40;
                sVar49 = 0;
                sVar58 = 0;
                sVar59 = 0;
                sVar60 = 0;
                iVar30 = 0;
                uVar41 = 0;
              }
              ppVar33->score = (int)sVar49;
              ppVar33->end_query = uVar41;
              ppVar33->end_ref = iVar30;
              *(int *)(ppVar33->field_4).extra = (int)sVar58;
              ((ppVar33->field_4).stats)->similar = (int)sVar59;
              ((ppVar33->field_4).stats)->length = (int)sVar60;
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(ptr);
              parasail_free(b_02);
              parasail_free(b_01);
              parasail_free(b_00);
              parasail_free(b);
              return ppVar33;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile16.score;
    pvPm = (__m128i*)profile->profile16.matches;
    pvPs = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi16(segLen), 2);
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            vGapperL = _mm_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHpM = _mm_slli_si128(vHpM, 2);
        vHpS = _mm_slli_si128(vHpS, 2);
        vHpL = _mm_slli_si128(vHpL, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi16(vH, vGapO);
            vE_ext = _mm_subs_epi16(vE, vGapE);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8_rpl(vEM, vHM, case1);
            vES = _mm_blendv_epi8_rpl(vES, vHS, case1);
            vEL = _mm_blendv_epi8_rpl(vEL, vHL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vGapper = _mm_adds_epi16(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vF, vGapper),
                    _mm_cmpeq_epi16(vF, vGapper));
            vF = _mm_max_epi16(vF, vGapper);
            vFM = _mm_blendv_epi8_rpl(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8_rpl(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8_rpl(
                    _mm_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi16(vHp, vW);
            vHpM = _mm_adds_epi16(vHpM, vWM);
            vHpS = _mm_adds_epi16(vHpS, vWS);
            vHpL = _mm_adds_epi16(vHpL, vOne);
            case1 = _mm_cmpgt_epi16(vE, vHp);
            vHt = _mm_max_epi16(vE, vHp);
            vHtM = _mm_blendv_epi8_rpl(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8_rpl(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8_rpl(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHtM = _mm_slli_si128(vHtM, 2);
        vHtS = _mm_slli_si128(vHtS, 2);
        vHtL = _mm_slli_si128(vHtL, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi16(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi16(vGapper, vF),
                _mm_cmpeq_epi16(vGapper, vF));
        vF = _mm_max_epi16(vF, vGapper);
        vFM = _mm_blendv_epi8_rpl(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8_rpl(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8_rpl(
                vFL,
                _mm_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            __m128i vFtM = _mm_slli_si128(vFM, 2);
            __m128i vFtS = _mm_slli_si128(vFS, 2);
            __m128i vFtL = _mm_slli_si128(vFL, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vFt, vF),
                    _mm_cmpeq_epi16(vFt, vF));
            vF = _mm_max_epi16(vF, vFt);
            vFM = _mm_blendv_epi8_rpl(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8_rpl(
                    vFL,
                    _mm_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vFM = _mm_slli_si128(vFM, 2);
        vFS = _mm_slli_si128(vFS, 2);
        vFL = _mm_slli_si128(vFL, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi16(vF, vHt);
        vH = _mm_max_epi16(vF, vHt);
        vHM = _mm_blendv_epi8_rpl(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8_rpl(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8_rpl(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi16(vH, vGapO);
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8_rpl(vFM, vHM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vHS, case1);
            vFL = _mm_blendv_epi8_rpl(vFL, vHL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vH = _mm_max_epi16(vHp, vE);
            vH = _mm_max_epi16(vH, vF);
            case1 = _mm_cmpeq_epi16(vH, vHp);
            case2 = _mm_cmpeq_epi16(vH, vF);
            vHM = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
                vHM = _mm_slli_si128(vHM, 2);
                vHS = _mm_slli_si128(vHS, 2);
                vHL = _mm_slli_si128(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}